

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

StackSym * __thiscall
GlobOpt::GetOrCreateTaggedIntConstantStackSym(GlobOpt *this,int32 intConstantValue)

{
  long local_30;
  StackSym *local_28;
  StackSym *stackSym;
  
  local_28 = GetTaggedIntConstantStackSym(this,intConstantValue);
  if (local_28 == (StackSym *)0x0) {
    local_28 = StackSym::New(TyVar,this->func);
    local_30 = (long)intConstantValue;
    JsUtil::
    BaseDictionary<long,StackSym*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<long,StackSym*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<long,StackSym*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->intConstantToStackSymMap,&local_30,&local_28);
  }
  return local_28;
}

Assistant:

StackSym *GlobOpt::GetOrCreateTaggedIntConstantStackSym(const int32 intConstantValue) const
{
    StackSym *stackSym = GetTaggedIntConstantStackSym(intConstantValue);
    if(stackSym)
    {
        return stackSym;
    }

    stackSym = StackSym::New(TyVar,func);
    intConstantToStackSymMap->Add(intConstantValue, stackSym);
    return stackSym;
}